

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::handle_install_snapshot_resp_new_member(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  peer *pp;
  int iVar2;
  element_type *peVar3;
  ptr<snapshot_sync_ctx> pVar4;
  string local_60;
  ptr<snapshot_sync_ctx> sync_ctx;
  ptr<snapshot> snp;
  
  peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar2 < 4) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_60,"no server to join, the response must be very old.");
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp_new_member",0x195,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  if (resp->accepted_ == false) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 2 < iVar2)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,
                 "peer doesn\'t accept the snapshot installation request, next log idx %lu, but we can move forward"
                 ,resp->next_idx_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x19d,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
    peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  timer_helper::reset(&peVar3->last_resp_timer_);
  pVar4 = peer::get_snapshot_sync_ctx((peer *)&sync_ctx);
  if (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))
                          (peVar1,0,pVar4.
                                    super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi._M_pi), 0 < iVar2)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,
                 "SnapshotSyncContext must not be null: src %d dst %d my id %d leader id %d, maybe leader election happened in the meantime. next heartbeat or append request will cover it up."
                 ,(ulong)(uint)(resp->super_msg_base).src_,(ulong)(uint)(resp->super_msg_base).dst_,
                 (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1a8,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    goto LAB_0019cd47;
  }
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,
             &((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
      logical_object) {
    std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_60,
               &(resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
    if (local_60._M_dataplus._M_p == (pointer)0x0) goto LAB_0019ca94;
LAB_0019cc1a:
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar2)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_60,"snapshot install is done\n");
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1b5,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i =
         (((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_ + 1;
    UNLOCK();
    pp = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pp->matched_idx_ =
         (((sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->last_log_idx_;
    clear_snapshot_sync_ctx(this,pp);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 3 < iVar2)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,
                 "snapshot has been copied and applied to new server, continue to sync logs after snapshot, next log idx %lu, matched idx %lu"
                 ,(((this->srv_to_join_).
                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  next_log_idx_).super___atomic_base<unsigned_long>._M_i,
                 ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->matched_idx_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c1,&local_60);
LAB_0019cd20:
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    if (((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
         raw_binary) &&
       ((snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->size_ <=
        resp->next_idx_)) goto LAB_0019cc1a;
LAB_0019ca94:
    snapshot_sync_ctx::set_offset
              (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,resp->next_idx_);
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 4 < iVar2)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_60,"continue to send snapshot to new server at offset %lu",resp->next_idx_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp_new_member",0x1c5,&local_60);
      goto LAB_0019cd20;
    }
  }
  sync_log_to_new_srv(this,(((this->srv_to_join_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           next_log_idx_).super___atomic_base<unsigned_long>._M_i);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&snp.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0019cd47:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp_new_member(resp_msg& resp) {
    if (!srv_to_join_) {
        p_in("no server to join, the response must be very old.");
        return;
    }

    if (!resp.get_accepted()) {
        p_wn("peer doesn't accept the snapshot installation request, "
             "next log idx %" PRIu64 ", "
             "but we can move forward",
             resp.get_next_idx());
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
    }
    srv_to_join_->reset_resp_timer();

    ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
    if (sync_ctx == nullptr) {
        p_ft("SnapshotSyncContext must not be null: "
             "src %d dst %d my id %d leader id %d, "
             "maybe leader election happened in the meantime. "
             "next heartbeat or append request will cover it up.",
             resp.get_src(), resp.get_dst(), id_, leader_.load());
        return;
    }

    ptr<snapshot> snp = sync_ctx->get_snapshot();
    bool snp_install_done =
        ( snp->get_type() == snapshot::raw_binary &&
          resp.get_next_idx() >= snp->size() )         ||
        ( snp->get_type() == snapshot::logical_object &&
          resp.get_ctx() );

    if (snp_install_done) {
        // snapshot is done
        p_in("snapshot install is done\n");
        srv_to_join_->set_next_log_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() + 1 );
        srv_to_join_->set_matched_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() );

        clear_snapshot_sync_ctx(*srv_to_join_);

        p_in( "snapshot has been copied and applied to new server, "
              "continue to sync logs after snapshot, "
              "next log idx %" PRIu64 ", matched idx %" PRIu64 "",
              srv_to_join_->get_next_log_idx(),
              srv_to_join_->get_matched_idx() );
    } else {
        sync_ctx->set_offset(resp.get_next_idx());
        p_db( "continue to send snapshot to new server at offset %" PRIu64 "",
              resp.get_next_idx() );
    }

    sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
}